

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtab.c
# Opt level: O3

void StrTab_Clear(strtab *p)

{
  cc_memheap *pcVar1;
  void *pvVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (7 < (p->Table)._Used) {
    pcVar4 = (p->Table)._Begin;
    do {
      pcVar1 = p->Heap;
      pvVar2 = *(void **)pcVar4;
      sVar3 = tcsbytes((tchar_t *)((long)pvVar2 + 8));
      (*pcVar1->Free)(pcVar1,pvVar2,sVar3 + 8);
      pcVar4 = pcVar4 + 8;
    } while (pcVar4 != (p->Table)._Begin + ((p->Table)._Used & 0xfffffffffffffff8));
  }
  ArrayClear(&p->Table);
  return;
}

Assistant:

static NOINLINE void StrTab_Clear(strtab* p)
{
	stringdef **i;
	for (i=ARRAYBEGIN(p->Table,stringdef*);i!=ARRAYEND(p->Table,stringdef*);++i)
        MemHeap_Free(p->Heap,*i,sizeof(stringdef)+tcsbytes((tchar_t*)(*i+1)));
    ArrayClear(&p->Table);
}